

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_alloc_helpers.hpp
# Opt level: O0

void asio_handler_alloc_helpers::
     deallocate<asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,asio::stream_socket_service<asio::ip::tcp>>,asio::basic_streambuf_ref<std::allocator<char>>,asio::detail::transfer_exactly_t,tonk::gateway::HTTPRequester::ContinueReadingBody()::__0>>
               (void *p,size_t s,
               read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>
               *h)

{
  size_t in_RDX;
  void *in_RSI;
  
  asio::detail::
  asio_handler_deallocate<asio::basic_stream_socket<asio::ip::tcp,asio::stream_socket_service<asio::ip::tcp>>,asio::basic_streambuf_ref<std::allocator<char>>,asio::detail::transfer_exactly_t,tonk::gateway::HTTPRequester::ContinueReadingBody()::__0>
            (in_RSI,in_RDX,
             (read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>
              *)0x21abf5);
  return;
}

Assistant:

inline void deallocate(void* p, std::size_t s, Handler& h)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  ::operator delete(p);
#else
  using asio::asio_handler_deallocate;
  asio_handler_deallocate(p, s, asio::detail::addressof(h));
#endif
}